

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

Vec_Int_t * Pdr_ManCubeToLits(Pdr_Man_t *p,int k,Pdr_Set_t *pCube,int fCompl,int fNext)

{
  Aig_Man_t *pAVar1;
  abctime aVar2;
  Aig_Obj_t *pObj;
  abctime aVar3;
  int iVar4;
  long lVar5;
  
  aVar2 = Abc_Clock();
  p->vLits->nSize = 0;
  if (fCompl != 0 && fNext != 0) {
    __assert_fail("!(fNext && fCompl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                  ,0x94,"Vec_Int_t *Pdr_ManCubeToLits(Pdr_Man_t *, int, Pdr_Set_t *, int, int)");
  }
  lVar5 = 0;
  do {
    if (pCube->nLits <= lVar5) {
      aVar3 = Abc_Clock();
      p->tCnf = p->tCnf + (aVar3 - aVar2);
      return p->vLits;
    }
    if (*(int *)(&pCube->field_0x14 + lVar5 * 4) != -1) {
      iVar4 = *(int *)(&pCube->field_0x14 + lVar5 * 4) >> 1;
      pAVar1 = p->pAig;
      if (fNext == 0) {
        pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar1->vCis,iVar4 + pAVar1->nTruePis);
        iVar4 = 3;
      }
      else {
        pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar1->vCos,iVar4 + pAVar1->nTruePos);
        iVar4 = 2 - (*(uint *)(&pCube->field_0x14 + lVar5 * 4) & 1);
      }
      iVar4 = Pdr_ObjSatVar(p,k,iVar4,pObj);
      if (iVar4 < 0) {
        __assert_fail("iVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                      ,0x9d,"Vec_Int_t *Pdr_ManCubeToLits(Pdr_Man_t *, int, Pdr_Set_t *, int, int)")
        ;
      }
      Vec_IntPush(p->vLits,(uint)((*(uint *)(&pCube->field_0x14 + lVar5 * 4) & 1) != fCompl) +
                           iVar4 * 2);
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Pdr_ManCubeToLits( Pdr_Man_t * p, int k, Pdr_Set_t * pCube, int fCompl, int fNext )
{
    Aig_Obj_t * pObj;
    int i, iVar, iVarMax = 0;
    abctime clk = Abc_Clock();
    Vec_IntClear( p->vLits );
    assert( !(fNext && fCompl) );
    for ( i = 0; i < pCube->nLits; i++ )
    {
        if ( pCube->Lits[i] == -1 )
            continue;
        if ( fNext )
            pObj = Saig_ManLi( p->pAig, lit_var(pCube->Lits[i]) );
        else
            pObj = Saig_ManLo( p->pAig, lit_var(pCube->Lits[i]) );
        iVar = Pdr_ObjSatVar( p, k, fNext ? 2 - lit_sign(pCube->Lits[i]) : 3, pObj ); assert( iVar >= 0 );
        iVarMax = Abc_MaxInt( iVarMax, iVar );
        Vec_IntPush( p->vLits, toLitCond( iVar, fCompl ^ lit_sign(pCube->Lits[i]) ) );
    }
//    sat_solver_setnvars( Pdr_ManSolver(p, k), iVarMax + 1 );
    p->tCnf += Abc_Clock() - clk;
    return p->vLits;
}